

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O0

double find_split_full_gain_weighted<float,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,long_double>
                 (float *x,size_t st,size_t end,size_t *ix_arr,size_t *cols_use,size_t ncols_use,
                 bool force_cols_use,double *X_row_major,size_t ncols,double *Xr,size_t *Xr_ind,
                 size_t *Xr_indptr,double *buffer_sum_left,double *buffer_sum_tot,size_t *split_ix,
                 double *split_point,bool x_uses_ix_arr,
                 robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                 *w)

{
  float *pfVar1;
  float fVar2;
  long lVar3;
  ulong uVar4;
  double *pdVar5;
  ulong *__last;
  difference_type dVar6;
  long in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  ulong *in_R8;
  ulong in_R9;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  byte in_stack_00000008;
  long in_stack_00000010;
  ulong in_stack_00000018;
  long in_stack_00000020;
  long in_stack_00000028;
  long in_stack_00000030;
  void *in_stack_00000038;
  void *in_stack_00000040;
  ulong *in_stack_00000048;
  double *in_stack_00000050;
  byte in_stack_00000058;
  unsigned_long *in_stack_00000060;
  size_t col_6;
  size_t row_12;
  size_t dtemp_1;
  double w_row_5;
  size_t *cols_end_1;
  double *Xr_this_1;
  size_t *curr_col_1;
  size_t *row_end_1;
  size_t *curr_begin_1;
  size_t col_5;
  size_t row_11;
  double w_row_4;
  size_t ptr_this_1;
  size_t col_4;
  size_t col_3;
  size_t row_10;
  double w_row_3;
  double *ptr_row_1;
  size_t col_2;
  size_t row_9;
  double wright;
  double w_row;
  double wleft;
  double vright;
  double vleft;
  double sr;
  double sl;
  double this_gain;
  double best_gain;
  size_t dtemp;
  size_t row_8;
  double w_row_2;
  size_t *cols_end;
  double *Xr_this;
  size_t *curr_col;
  size_t *row_end;
  size_t *curr_begin;
  size_t row_7;
  size_t row_6;
  size_t ptr_this;
  size_t col_1;
  size_t row_5;
  size_t col;
  size_t row_4;
  double w_row_1;
  double *ptr_row;
  size_t row_3;
  size_t row_2;
  size_t row_1;
  size_t row;
  double wtot;
  float in_stack_fffffffffffffd68;
  float in_stack_fffffffffffffd6c;
  robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  *in_stack_fffffffffffffd70;
  double *in_stack_fffffffffffffd78;
  undefined7 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd87;
  undefined1 uVar10;
  double *in_stack_fffffffffffffd88;
  unsigned_long *in_stack_fffffffffffffd90;
  unsigned_long *__first;
  ulong local_238;
  ulong local_200;
  ulong local_1d8;
  ulong local_1d0;
  long local_1c8;
  robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  *local_1c0;
  ulong *local_1b8;
  double *local_1b0;
  ulong *local_1a8;
  ulong *local_1a0;
  ulong *local_198;
  ulong local_190;
  ulong local_188;
  double local_180;
  undefined8 local_178;
  ulong local_170;
  ulong local_168;
  ulong local_160;
  double local_158;
  long local_150;
  ulong local_148;
  ulong local_140;
  double local_138;
  double local_130;
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  long local_f0;
  ulong local_e8;
  double local_e0;
  ulong *local_d8;
  long local_d0;
  ulong *local_c8;
  ulong *local_c0;
  ulong *local_b8;
  ulong local_b0;
  ulong local_a8;
  undefined8 local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  double local_78;
  long local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  double local_48;
  byte local_3a;
  byte local_39;
  ulong local_38;
  ulong *local_30;
  long local_28;
  ulong local_20;
  ulong local_18;
  long local_10;
  double local_8;
  
  local_39 = in_stack_00000008 & 1;
  local_3a = in_stack_00000058 & 1;
  if (in_RSI < in_RDX) {
    if (((in_R8 != (ulong *)0x0) && (in_R9 != 0)) &&
       (auVar9._8_4_ = (int)(in_R9 >> 0x20), auVar9._0_8_ = in_R9, auVar9._12_4_ = 0x45300000,
       auVar8._8_4_ = (int)(in_stack_00000018 >> 0x20), auVar8._0_8_ = in_stack_00000018,
       auVar8._12_4_ = 0x45300000,
       ((auVar9._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)in_R9) - 4503599627370496.0)) /
       ((auVar8._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)in_stack_00000018) - 4503599627370496.0)) < 0.1)) {
      local_39 = 1;
    }
    local_48 = 0.0;
    uVar4 = in_RSI;
    local_38 = in_R9;
    local_30 = in_R8;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    if (local_3a == 0) {
      while (local_58 = uVar4, local_58 <= local_20) {
        pdVar5 = tsl::
                 robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                 ::operator[](in_stack_fffffffffffffd70,
                              (unsigned_long *)
                              CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
        local_48 = *pdVar5 + local_48;
        uVar4 = local_58 + 1;
      }
    }
    else {
      while (local_50 = uVar4, local_50 <= local_20) {
        pdVar5 = tsl::
                 robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                 ::operator[](in_stack_fffffffffffffd70,
                              (unsigned_long *)
                              CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
        local_48 = *pdVar5 + local_48;
        uVar4 = local_50 + 1;
      }
    }
    if ((local_39 & 1) == 0) {
      local_200 = in_stack_00000018;
    }
    else {
      local_200 = local_38;
    }
    memset(in_stack_00000040,0,local_200 << 3);
    if (in_stack_00000030 == 0) {
      if ((local_39 & 1) == 0) {
        if ((local_3a & 1) == 0) {
          for (local_68 = local_18; local_68 <= local_20; local_68 = local_68 + 1) {
            tsl::
            robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
            ::operator[](in_stack_fffffffffffffd70,
                         (unsigned_long *)
                         CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
            axpy1((double)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                  in_stack_fffffffffffffd78,(double *)in_stack_fffffffffffffd70,
                  CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
          }
        }
        else {
          for (local_60 = local_18; local_60 <= local_20; local_60 = local_60 + 1) {
            tsl::
            robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
            ::operator[](in_stack_fffffffffffffd70,
                         (unsigned_long *)
                         CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
            axpy1((double)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                  in_stack_fffffffffffffd78,(double *)in_stack_fffffffffffffd70,
                  CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
          }
        }
      }
      else if ((local_3a & 1) == 0) {
        for (local_90 = local_18; local_90 <= local_20; local_90 = local_90 + 1) {
          local_70 = in_stack_00000010 + *(long *)(local_28 + local_90 * 8) * in_stack_00000018 * 8;
          pdVar5 = tsl::
                   robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                   ::operator[](in_stack_fffffffffffffd70,
                                (unsigned_long *)
                                CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
          local_78 = *pdVar5;
          for (local_98 = 0; local_98 < local_38; local_98 = local_98 + 1) {
            dVar7 = fma(local_78,*(double *)(local_70 + local_30[local_98] * 8),
                        *(double *)((long)in_stack_00000040 + local_98 * 8));
            *(double *)((long)in_stack_00000040 + local_98 * 8) = dVar7;
          }
        }
      }
      else {
        for (local_80 = local_18; local_80 <= local_20; local_80 = local_80 + 1) {
          local_70 = in_stack_00000010 + *(long *)(local_28 + local_80 * 8) * in_stack_00000018 * 8;
          pdVar5 = tsl::
                   robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                   ::operator[](in_stack_fffffffffffffd70,
                                (unsigned_long *)
                                CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
          local_78 = *pdVar5;
          for (local_88 = 0; local_88 < local_38; local_88 = local_88 + 1) {
            dVar7 = fma(local_78,*(double *)(local_70 + local_30[local_88] * 8),
                        *(double *)((long)in_stack_00000040 + local_88 * 8));
            *(double *)((long)in_stack_00000040 + local_88 * 8) = dVar7;
          }
        }
      }
    }
    else if ((local_39 & 1) == 0) {
      if ((local_3a & 1) == 0) {
        for (local_b0 = local_18; local_b0 <= local_20; local_b0 = local_b0 + 1) {
          local_a0 = *(undefined8 *)(in_stack_00000030 + *(long *)(local_28 + local_b0 * 8) * 8);
          tsl::
          robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
          ::operator[](in_stack_fffffffffffffd70,
                       (unsigned_long *)
                       CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
          axpy1((double)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                (size_t *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                (size_t)in_stack_fffffffffffffd78,(double *)in_stack_fffffffffffffd70);
        }
      }
      else {
        for (local_a8 = local_18; local_a8 <= local_20; local_a8 = local_a8 + 1) {
          local_a0 = *(undefined8 *)(in_stack_00000030 + *(long *)(local_28 + local_a8 * 8) * 8);
          tsl::
          robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
          ::operator[](in_stack_fffffffffffffd70,
                       (unsigned_long *)
                       CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
          axpy1((double)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                (size_t *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                (size_t)in_stack_fffffffffffffd78,(double *)in_stack_fffffffffffffd70);
        }
      }
    }
    else {
      local_d8 = local_30 + local_38;
      for (local_e8 = local_18; local_e8 <= local_20; local_e8 = local_e8 + 1) {
        local_b8 = (ulong *)(in_stack_00000028 +
                            *(long *)(in_stack_00000030 + *(long *)(local_28 + local_e8 * 8) * 8) *
                            8);
        local_c0 = (ulong *)(in_stack_00000028 +
                            *(long *)(in_stack_00000030 + 8 + *(long *)(local_28 + local_e8 * 8) * 8
                                     ) * 8);
        if (local_b8 != local_c0) {
          local_c8 = local_30;
          local_d0 = in_stack_00000020 +
                     *(long *)(in_stack_00000030 + *(long *)(local_28 + local_e8 * 8) * 8) * 8;
          pdVar5 = tsl::
                   robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                   ::operator[](in_stack_fffffffffffffd70,
                                (unsigned_long *)
                                CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
          local_e0 = *pdVar5;
          while (local_c8 < local_d8 && local_b8 < local_c0) {
            if (*local_b8 == *local_c8) {
              local_f0 = std::distance<unsigned_long*>
                                   ((unsigned_long *)
                                    CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                                    (unsigned_long *)in_stack_fffffffffffffd78);
              lVar3 = local_d0;
              dVar7 = local_e0;
              dVar6 = std::distance<unsigned_long*>
                                ((unsigned_long *)
                                 CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                                 (unsigned_long *)in_stack_fffffffffffffd78);
              dVar7 = fma(dVar7,*(double *)(lVar3 + dVar6 * 8),
                          *(double *)((long)in_stack_00000040 + local_f0 * 8));
              *(double *)((long)in_stack_00000040 + local_f0 * 8) = dVar7;
              local_c8 = local_c8 + 1;
              local_b8 = local_b8 + 1;
            }
            else if (*local_c8 < *local_b8) {
              local_c8 = std::lower_bound<unsigned_long*,unsigned_long>
                                   (in_stack_fffffffffffffd90,
                                    (unsigned_long *)in_stack_fffffffffffffd88,
                                    (unsigned_long *)
                                    CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
            }
            else {
              local_b8 = std::lower_bound<unsigned_long*,unsigned_long>
                                   (in_stack_fffffffffffffd90,
                                    (unsigned_long *)in_stack_fffffffffffffd88,
                                    (unsigned_long *)
                                    CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
            }
          }
        }
      }
    }
    local_f8 = -INFINITY;
    local_128 = 0.0;
    if ((local_39 & 1) == 0) {
      local_238 = in_stack_00000018;
    }
    else {
      local_238 = local_38;
    }
    memset(in_stack_00000038,0,local_238 << 3);
    if (in_stack_00000030 == 0) {
      if ((local_39 & 1) == 0) {
        for (local_140 = local_18; local_140 < local_20; local_140 = local_140 + 1) {
          pdVar5 = tsl::
                   robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                   ::operator[](in_stack_fffffffffffffd70,
                                (unsigned_long *)
                                CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
          local_130 = *pdVar5;
          local_128 = local_130 + local_128;
          axpy1((double)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                in_stack_fffffffffffffd78,(double *)in_stack_fffffffffffffd70,
                CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
          if ((local_3a & 1) == 0) {
            fVar2 = *(float *)(local_10 + local_140 * 4);
            pfVar1 = (float *)(local_10 + 4 + local_140 * 4);
            if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) goto LAB_004ce651;
          }
          else {
            fVar2 = *(float *)(local_10 + *(long *)(local_28 + local_140 * 8) * 4);
            pfVar1 = (float *)(local_10 + *(long *)(local_28 + 8 + local_140 * 8) * 4);
            if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
LAB_004ce651:
              local_118 = 0.0;
              local_120 = 0.0;
              local_138 = local_48 - local_128;
              for (local_148 = 0; local_148 < in_stack_00000018; local_148 = local_148 + 1) {
                local_108 = *(double *)((long)in_stack_00000038 + local_148 * 8);
                local_118 = local_108 * (local_108 / local_128) + local_118;
                local_110 = *(double *)((long)in_stack_00000040 + local_148 * 8) - local_108;
                local_120 = local_110 * (local_110 / local_138) + local_120;
              }
              local_100 = local_118 + local_120;
              if (local_f8 < local_100) {
                *in_stack_00000048 = local_140;
                local_f8 = local_100;
              }
            }
          }
        }
      }
      else {
        for (local_160 = local_18; local_160 < local_20; local_160 = local_160 + 1) {
          pdVar5 = tsl::
                   robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                   ::operator[](in_stack_fffffffffffffd70,
                                (unsigned_long *)
                                CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
          local_158 = *pdVar5;
          local_128 = local_158 + local_128;
          local_150 = in_stack_00000010 +
                      *(long *)(local_28 + local_160 * 8) * in_stack_00000018 * 8;
          for (local_168 = 0; local_168 < local_38; local_168 = local_168 + 1) {
            dVar7 = fma(local_158,*(double *)(local_150 + local_30[local_168] * 8),
                        *(double *)((long)in_stack_00000038 + local_168 * 8));
            *(double *)((long)in_stack_00000038 + local_168 * 8) = dVar7;
          }
          if ((local_3a & 1) == 0) {
            fVar2 = *(float *)(local_10 + local_160 * 4);
            pfVar1 = (float *)(local_10 + 4 + local_160 * 4);
            if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) goto LAB_004ce9d3;
          }
          else {
            fVar2 = *(float *)(local_10 + *(long *)(local_28 + local_160 * 8) * 4);
            pfVar1 = (float *)(local_10 + *(long *)(local_28 + 8 + local_160 * 8) * 4);
            if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
LAB_004ce9d3:
              local_118 = 0.0;
              local_120 = 0.0;
              local_138 = local_48 - local_128;
              for (local_170 = 0; local_170 < local_38; local_170 = local_170 + 1) {
                local_108 = *(double *)((long)in_stack_00000038 + local_170 * 8);
                local_118 = local_108 * (local_108 / local_128) + local_118;
                local_110 = *(double *)((long)in_stack_00000040 + local_170 * 8) - local_108;
                local_120 = local_110 * (local_110 / local_138) + local_120;
              }
              local_100 = local_118 + local_120;
              if (local_f8 < local_100) {
                *in_stack_00000048 = local_160;
                local_f8 = local_100;
              }
            }
          }
        }
      }
    }
    else if ((local_39 & 1) == 0) {
      for (local_188 = local_18; local_188 < local_20; local_188 = local_188 + 1) {
        pdVar5 = tsl::
                 robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                 ::operator[](in_stack_fffffffffffffd70,
                              (unsigned_long *)
                              CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
        local_180 = *pdVar5;
        local_128 = local_180 + local_128;
        local_178 = *(undefined8 *)(in_stack_00000030 + *(long *)(local_28 + local_188 * 8) * 8);
        axpy1((double)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
              (size_t *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
              (size_t)in_stack_fffffffffffffd78,(double *)in_stack_fffffffffffffd70);
        if ((local_3a & 1) == 0) {
          fVar2 = *(float *)(local_10 + local_188 * 4);
          pfVar1 = (float *)(local_10 + 4 + local_188 * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) goto LAB_004ced36;
        }
        else {
          fVar2 = *(float *)(local_10 + *(long *)(local_28 + local_188 * 8) * 4);
          pfVar1 = (float *)(local_10 + *(long *)(local_28 + 8 + local_188 * 8) * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
LAB_004ced36:
            local_118 = 0.0;
            local_120 = 0.0;
            local_138 = local_48 - local_128;
            for (local_190 = 0; local_190 < in_stack_00000018; local_190 = local_190 + 1) {
              local_108 = *(double *)((long)in_stack_00000038 + local_190 * 8);
              local_118 = local_108 * (local_108 / local_128) + local_118;
              local_110 = *(double *)((long)in_stack_00000040 + local_190 * 8) - local_108;
              local_120 = local_110 * (local_110 / local_138) + local_120;
            }
            local_100 = local_118 + local_120;
            if (local_f8 < local_100) {
              *in_stack_00000048 = local_188;
              local_f8 = local_100;
            }
          }
        }
      }
    }
    else {
      local_1b8 = local_30 + local_38;
      for (local_1d0 = local_18; local_1d0 < local_20; local_1d0 = local_1d0 + 1) {
        if ((local_3a & 1) == 0) {
          __last = &local_1d0;
        }
        else {
          __last = (ulong *)(local_28 + local_1d0 * 8);
        }
        __first = in_stack_00000060;
        pdVar5 = tsl::
                 robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                 ::operator[](in_stack_fffffffffffffd70,
                              (unsigned_long *)
                              CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
        local_1c0 = (robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                     *)*pdVar5;
        local_128 = (double)local_1c0 + local_128;
        local_198 = (ulong *)(in_stack_00000028 +
                             *(long *)(in_stack_00000030 + *(long *)(local_28 + local_1d0 * 8) * 8)
                             * 8);
        local_1a0 = (ulong *)(in_stack_00000028 +
                             *(long *)(in_stack_00000030 + 8 +
                                      *(long *)(local_28 + local_1d0 * 8) * 8) * 8);
        if (local_198 != local_1a0) {
          local_1a8 = local_30;
          local_1b0 = (double *)
                      (in_stack_00000020 +
                      *(long *)(in_stack_00000030 + *(long *)(local_28 + local_1d0 * 8) * 8) * 8);
          while (uVar10 = local_1a8 < local_1b8 && local_198 < local_1a0,
                local_1a8 < local_1b8 && local_198 < local_1a0) {
            if (*local_198 == *local_1a8) {
              local_1c8 = std::distance<unsigned_long*>
                                    ((unsigned_long *)CONCAT17(uVar10,in_stack_fffffffffffffd80),
                                     (unsigned_long *)in_stack_fffffffffffffd78);
              in_stack_fffffffffffffd70 = local_1c0;
              in_stack_fffffffffffffd78 = local_1b0;
              dVar6 = std::distance<unsigned_long*>
                                ((unsigned_long *)CONCAT17(uVar10,in_stack_fffffffffffffd80),
                                 (unsigned_long *)local_1b0);
              dVar7 = fma((double)in_stack_fffffffffffffd70,in_stack_fffffffffffffd78[dVar6],
                          *(double *)((long)in_stack_00000038 + local_1c8 * 8));
              *(double *)((long)in_stack_00000038 + local_1c8 * 8) = dVar7;
              local_1a8 = local_1a8 + 1;
              local_198 = local_198 + 1;
            }
            else if (*local_1a8 < *local_198) {
              local_1a8 = std::lower_bound<unsigned_long*,unsigned_long>
                                    (__first,__last,
                                     (unsigned_long *)CONCAT17(uVar10,in_stack_fffffffffffffd80));
            }
            else {
              local_198 = std::lower_bound<unsigned_long*,unsigned_long>
                                    (__first,__last,
                                     (unsigned_long *)CONCAT17(uVar10,in_stack_fffffffffffffd80));
            }
          }
        }
        if ((local_3a & 1) == 0) {
          fVar2 = *(float *)(local_10 + local_1d0 * 4);
          pfVar1 = (float *)(local_10 + 4 + local_1d0 * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) goto LAB_004cf25f;
        }
        else {
          fVar2 = *(float *)(local_10 + *(long *)(local_28 + local_1d0 * 8) * 4);
          pfVar1 = (float *)(local_10 + *(long *)(local_28 + 8 + local_1d0 * 8) * 4);
          if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
LAB_004cf25f:
            local_118 = 0.0;
            local_120 = 0.0;
            local_138 = local_48 - local_128;
            for (local_1d8 = 0; local_1d8 < local_38; local_1d8 = local_1d8 + 1) {
              local_108 = *(double *)((long)in_stack_00000038 + local_1d8 * 8);
              local_118 = local_108 * (local_108 / local_128) + local_118;
              local_110 = *(double *)((long)in_stack_00000040 + local_1d8 * 8) - local_108;
              local_120 = local_110 * (local_110 / local_138) + local_120;
            }
            local_100 = local_118 + local_120;
            if (local_f8 < local_100) {
              *in_stack_00000048 = local_1d0;
              local_f8 = local_100;
            }
          }
        }
      }
    }
    if (-INFINITY < local_f8) {
      dVar7 = midpoint<float>(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68);
      *in_stack_00000050 = dVar7;
      local_8 = local_f8 / local_48;
    }
    else {
      local_8 = local_f8;
    }
  }
  else {
    local_8 = -INFINITY;
  }
  return local_8;
}

Assistant:

double find_split_full_gain_weighted(real_t *restrict x, size_t st, size_t end, size_t *restrict ix_arr,
                                     size_t *restrict cols_use, size_t ncols_use, bool force_cols_use,
                                     double *restrict X_row_major, size_t ncols,
                                     double *restrict Xr, size_t *restrict Xr_ind, size_t *restrict Xr_indptr,
                                     double *restrict buffer_sum_left, double *restrict buffer_sum_tot,
                                     size_t &restrict split_ix, double &restrict split_point,
                                     bool x_uses_ix_arr,
                                     mapping &restrict w)
{
    if (end <= st) return -HUGE_VAL;
    if (cols_use != NULL && ncols_use && (double)ncols_use / (double)ncols < 0.1)
        force_cols_use = true;

    double wtot = 0;
    if (x_uses_ix_arr)
    {
        for (size_t row = st; row <= end; row++)
            wtot += w[ix_arr[row]];
    }

    else
    {
        for (size_t row = st; row <= end; row++)
            wtot += w[row];
    }

    memset(buffer_sum_tot, 0, (force_cols_use? ncols_use : ncols)*sizeof(double));
    if (Xr_indptr == NULL)
    {
        if (!force_cols_use)
        {
            if (x_uses_ix_arr)
            {
                for (size_t row = st; row <= end; row++)
                    axpy1(w[ix_arr[row]], X_row_major + ix_arr[row]*ncols, buffer_sum_tot, ncols);
            }

            else
            {
                for (size_t row = st; row <= end; row++)
                    axpy1(w[row], X_row_major + ix_arr[row]*ncols, buffer_sum_tot, ncols);
            }
        }

        else
        {
            double *restrict ptr_row;
            double w_row;

            if (x_uses_ix_arr)
            {
                for (size_t row = st; row <= end; row++)
                {
                    ptr_row = X_row_major + ix_arr[row]*ncols;
                    w_row = w[ix_arr[row]];
                    for (size_t col = 0; col < ncols_use; col++)
                        buffer_sum_tot[col] = std::fma(w_row, ptr_row[cols_use[col]], buffer_sum_tot[col]);
                }
            }

            else
            {
                for (size_t row = st; row <= end; row++)
                {
                    ptr_row = X_row_major + ix_arr[row]*ncols;
                    w_row = w[row];
                    for (size_t col = 0; col < ncols_use; col++)
                        buffer_sum_tot[col] = std::fma(w_row, ptr_row[cols_use[col]], buffer_sum_tot[col]);
                }
            }
        }
    }

    else
    {
        if (!force_cols_use)
        {
            size_t ptr_this;
            if (x_uses_ix_arr)
            {
                for (size_t row = st; row <= end; row++)
                {
                    ptr_this = Xr_indptr[ix_arr[row]];
                    axpy1(w[ix_arr[row]], Xr + ptr_this, Xr_ind + ptr_this, Xr_indptr[ix_arr[row]+1] - ptr_this, buffer_sum_tot);
                }
            }

            else
            {
                for (size_t row = st; row <= end; row++)
                {
                    ptr_this = Xr_indptr[ix_arr[row]];
                    axpy1(w[row], Xr + ptr_this, Xr_ind + ptr_this, Xr_indptr[ix_arr[row]+1] - ptr_this, buffer_sum_tot);
                }
            }
        }

        else
        {
            size_t *curr_begin;
            size_t *row_end;
            size_t *curr_col;
            double *restrict Xr_this;
            size_t *cols_end = cols_use + ncols_use;
            double w_row;
            for (size_t row = st; row <= end; row++)
            {
                curr_begin = Xr_ind + Xr_indptr[ix_arr[row]];
                row_end = Xr_ind + Xr_indptr[ix_arr[row] + 1];
                if (curr_begin == row_end) continue;
                curr_col = cols_use;
                Xr_this = Xr + Xr_indptr[ix_arr[row]];
                w_row = w[x_uses_ix_arr? ix_arr[row] : row];
                size_t dtemp;
                
                while (curr_col < cols_end && curr_begin < row_end)
                {
                    if (*curr_begin == *curr_col)
                    {
                        dtemp = std::distance(cols_use, curr_col);
                        buffer_sum_tot[dtemp]
                            =
                        std::fma(w_row, Xr_this[std::distance(curr_begin, row_end)], buffer_sum_tot[dtemp]);
                        curr_col++;
                        curr_begin++;
                    }

                    else
                    {
                        if (*curr_begin > *curr_col)
                            curr_col = std::lower_bound(curr_col, cols_end, *curr_begin);
                        else
                            curr_begin = std::lower_bound(curr_begin, row_end, *curr_col);
                    }
                }
            }
        }
    }

    double best_gain = -HUGE_VAL;
    double this_gain;
    double sl, sr;
    double vleft, vright;
    double wleft = 0;
    double w_row;
    double wright;
    memset(buffer_sum_left, 0, (force_cols_use? ncols_use : ncols)*sizeof(double));
    if (Xr_indptr == NULL)
    {
        if (!force_cols_use)
        {
            for (size_t row = st; row < end; row++)
            {
                w_row = w[x_uses_ix_arr? ix_arr[row] : row];
                wleft += w_row;
                axpy1(w_row, X_row_major + ix_arr[row]*ncols, buffer_sum_left, ncols);
                if (x_uses_ix_arr) {
                    if (unlikely(x[ix_arr[row]] == x[ix_arr[row+1]])) continue;
                }
                else {
                    if (unlikely(x[row] == x[row+1])) continue;
                }

                vleft = 0;
                vright = 0;
                wright = wtot - wleft;
                for (size_t col = 0; col < ncols; col++)
                {
                    sl = buffer_sum_left[col];
                    vleft += sl * (sl / wleft);
                    sr = buffer_sum_tot[col] - sl;
                    vright += sr * (sr / wright);
                }

                this_gain = vleft + vright;
                if (this_gain > best_gain)
                {
                    best_gain = this_gain;
                    split_ix = row;
                }
            }
        }

        else
        {
            double *restrict ptr_row;
            double w_row;
            for (size_t row = st; row < end; row++)
            {
                w_row = w[x_uses_ix_arr? ix_arr[row] : row];
                wleft += w_row;

                ptr_row = X_row_major + ix_arr[row]*ncols;
                for (size_t col = 0; col < ncols_use; col++)
                    buffer_sum_left[col] = std::fma(w_row, ptr_row[cols_use[col]], buffer_sum_left[col]);
                if (x_uses_ix_arr) {
                    if (unlikely(x[ix_arr[row]] == x[ix_arr[row+1]])) continue;
                }
                else {
                    if (unlikely(x[row] == x[row+1])) continue;
                }

                vleft = 0;
                vright = 0;
                wright = wtot - wleft;
                for (size_t col = 0; col < ncols_use; col++)
                {
                    sl = buffer_sum_left[col];
                    vleft += sl * (sl / wleft);
                    sr = buffer_sum_tot[col] - sl;
                    vright += sr * (sr / wright);
                }

                this_gain = vleft + vright;
                if (this_gain > best_gain)
                {
                    best_gain = this_gain;
                    split_ix = row;
                }
            }
        }
    }

    else
    {
        if (!force_cols_use)
        {
            size_t ptr_this;
            double w_row;
            for (size_t row = st; row < end; row++)
            {
                w_row= w[x_uses_ix_arr? ix_arr[row] : row];
                wleft += w_row;
                ptr_this = Xr_indptr[ix_arr[row]];
                axpy1(w_row, Xr + ptr_this, Xr_ind + ptr_this, Xr_indptr[ix_arr[row]+1] - ptr_this, buffer_sum_left);
                if (x_uses_ix_arr) {
                    if (unlikely(x[ix_arr[row]] == x[ix_arr[row+1]])) continue;
                }
                else {
                    if (unlikely(x[row] == x[row+1])) continue;
                }

                vleft = 0;
                vright = 0;
                wright = wtot - wleft;
                for (size_t col = 0; col < ncols; col++)
                {
                    sl = buffer_sum_left[col];
                    vleft += sl * (sl / wleft);
                    sr = buffer_sum_tot[col] - sl;
                    vright += sr * (sr / wright);
                }

                this_gain = vleft + vright;
                if (this_gain > best_gain)
                {
                    best_gain = this_gain;
                    split_ix = row;
                }
            }
        }

        else
        {
            size_t *curr_begin;
            size_t *row_end;
            size_t *curr_col;
            double *restrict Xr_this;
            size_t *cols_end = cols_use + ncols_use;
            double w_row;
            size_t dtemp;
            for (size_t row = st; row < end; row++)
            {
                w_row = w[x_uses_ix_arr? ix_arr[row] : row];
                wleft += w_row;
                
                curr_begin = Xr_ind + Xr_indptr[ix_arr[row]];
                row_end = Xr_ind + Xr_indptr[ix_arr[row] + 1];
                if (curr_begin == row_end) goto skip_sum;
                curr_col = cols_use;
                Xr_this = Xr + Xr_indptr[ix_arr[row]];
                while (curr_col < cols_end && curr_begin < row_end)
                {
                    if (*curr_begin == *curr_col)
                    {
                        dtemp = std::distance(cols_use, curr_col);
                        buffer_sum_left[dtemp]
                            =
                        std::fma(w_row, Xr_this[std::distance(curr_begin, row_end)], buffer_sum_left[dtemp]);
                        curr_col++;
                        curr_begin++;
                    }

                    else
                    {
                        if (*curr_begin > *curr_col)
                            curr_col = std::lower_bound(curr_col, cols_end, *curr_begin);
                        else
                            curr_begin = std::lower_bound(curr_begin, row_end, *curr_col);
                    }
                }

                skip_sum:
                if (x_uses_ix_arr) {
                    if (unlikely(x[ix_arr[row]] == x[ix_arr[row+1]])) continue;
                }
                else {
                    if (unlikely(x[row] == x[row+1])) continue;
                }

                vleft = 0;
                vright = 0;
                wright = wtot - wleft;
                for (size_t col = 0; col < ncols_use; col++)
                {
                    sl = buffer_sum_left[col];
                    vleft += sl * (sl / wleft);
                    sr = buffer_sum_tot[col] - sl;
                    vright += sr * (sr / wright);
                }

                this_gain = vleft + vright;
                if (this_gain > best_gain)
                {
                    best_gain = this_gain;
                    split_ix = row;
                }
            }
        }
    }

    if (best_gain  <= -HUGE_VAL) return best_gain;
    
    split_point = midpoint(x[ix_arr[split_ix]], x[ix_arr[split_ix+1]]);
    return best_gain / wtot;
}